

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O1

void slsolve(int ldm,int ncol,float *M,float *rhs)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  uVar3 = 0;
  if (7 < ncol) {
    lVar7 = (long)ldm;
    uVar3 = 0;
    pfVar4 = rhs;
    uVar11 = (ulong)(uint)ncol;
    do {
      fVar1 = rhs[uVar3];
      fVar13 = rhs[uVar3 + 1] - M[1] * fVar1;
      fVar14 = (rhs[uVar3 + 2] - M[2] * fVar1) - M[lVar7 + 2] * fVar13;
      fVar15 = ((rhs[uVar3 + 3] - M[3] * fVar1) - M[lVar7 + 3] * fVar13) - M[lVar7 * 2 + 3] * fVar14
      ;
      fVar16 = (((rhs[uVar3 + 4] - M[4] * fVar1) - M[lVar7 + 4] * fVar13) -
               M[lVar7 * 2 + 4] * fVar14) - M[lVar7 * 3 + 4] * fVar15;
      fVar17 = ((((rhs[uVar3 + 5] - M[5] * fVar1) - M[lVar7 + 5] * fVar13) -
                M[lVar7 * 2 + 5] * fVar14) - M[lVar7 * 3 + 5] * fVar15) - M[lVar7 * 4 + 5] * fVar16;
      fVar18 = (((((rhs[uVar3 + 6] - M[6] * fVar1) - M[lVar7 + 6] * fVar13) -
                 M[lVar7 * 2 + 6] * fVar14) - M[lVar7 * 3 + 6] * fVar15) - M[lVar7 * 4 + 6] * fVar16
               ) - M[lVar7 * 5 + 6] * fVar17;
      fVar19 = ((((((rhs[uVar3 + 7] - M[7] * fVar1) - M[lVar7 + 7] * fVar13) -
                  M[lVar7 * 2 + 7] * fVar14) - M[lVar7 * 3 + 7] * fVar15) -
                M[lVar7 * 4 + 7] * fVar16) - M[lVar7 * 5 + 7] * fVar17) - M[lVar7 * 6 + 7] * fVar18;
      rhs[uVar3 + 1] = fVar13;
      rhs[uVar3 + 2] = fVar14;
      rhs[uVar3 + 3] = fVar15;
      rhs[uVar3 + 4] = fVar16;
      rhs[uVar3 + 5] = fVar17;
      rhs[uVar3 + 6] = fVar18;
      rhs[uVar3 + 7] = fVar19;
      uVar3 = uVar3 + 8;
      if (uVar3 < (uint)ncol) {
        uVar5 = 8;
        do {
          pfVar9 = M + uVar5;
          pfVar4[uVar5] =
               pfVar9[lVar7 * 7] * -fVar19 +
               pfVar9[lVar7 * 6] * -fVar18 +
               pfVar9[lVar7 * 5] * -fVar17 +
               pfVar9[lVar7 * 4] * -fVar16 +
               pfVar9[lVar7 * 3] * -fVar15 +
               pfVar9[lVar7 * 2] * -fVar14 +
               pfVar9[lVar7] * -fVar13 + *pfVar9 * -fVar1 + pfVar4[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
      M = M + (ldm * 8 + 8);
      pfVar4 = pfVar4 + 8;
      uVar11 = uVar11 - 8;
    } while ((long)uVar3 < (long)(ncol + -7));
  }
  if ((int)uVar3 < ncol + -3) {
    lVar7 = (long)ldm;
    iVar8 = ldm * 4 + 4;
    uVar3 = uVar3 & 0xffffffff;
    pfVar4 = rhs + uVar3 + 4;
    pfVar12 = M + lVar7 * 3 + 4;
    pfVar9 = M + lVar7 * 2 + 4;
    pfVar10 = M + lVar7 + 4;
    uVar11 = uVar3;
    do {
      uVar11 = uVar11 + 4;
      fVar1 = rhs[uVar3];
      fVar13 = rhs[uVar3 + 1] - M[1] * fVar1;
      fVar14 = (rhs[uVar3 + 2] - M[2] * fVar1) - M[lVar7 + 2] * fVar13;
      fVar15 = ((rhs[uVar3 + 3] - M[3] * fVar1) - M[lVar7 + 3] * fVar13) - M[lVar7 * 2 + 3] * fVar14
      ;
      rhs[uVar3 + 1] = fVar13;
      rhs[uVar3 + 2] = fVar14;
      rhs[uVar3 + 3] = fVar15;
      uVar3 = uVar3 + 4;
      if ((long)uVar3 < (long)ncol) {
        lVar6 = 0;
        do {
          pfVar4[lVar6] =
               pfVar12[lVar6] * -fVar15 +
               pfVar9[lVar6] * -fVar14 +
               pfVar10[lVar6] * -fVar13 + M[lVar6 + 4] * -fVar1 + pfVar4[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)uVar11 + (int)lVar6 < ncol);
      }
      M = M + iVar8;
      pfVar4 = pfVar4 + 4;
      pfVar12 = pfVar12 + iVar8;
      pfVar9 = pfVar9 + iVar8;
      pfVar10 = pfVar10 + iVar8;
    } while ((long)uVar3 < (long)(ncol + -3));
  }
  uVar2 = (uint)uVar3;
  if ((int)uVar2 < ncol + -1) {
    uVar3 = uVar3 & 0xffffffff;
    fVar1 = rhs[uVar3];
    fVar13 = rhs[uVar3 | 1] - M[1] * fVar1;
    rhs[uVar3 + 1] = fVar13;
    if ((int)(uVar2 | 2) < ncol) {
      lVar7 = 2;
      do {
        rhs[uVar3 + lVar7] = M[ldm + lVar7] * -fVar13 + M[lVar7] * -fVar1 + rhs[uVar3 + lVar7];
        lVar7 = lVar7 + 1;
      } while ((int)(uVar2 + (int)lVar7) < ncol);
    }
  }
  return;
}

Assistant:

void slsolve ( int ldm, int ncol, float *M, float *rhs )
{
    int k;
    float x0, x1, x2, x3, x4, x5, x6, x7;
    float *M0;
    register float *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;

    M0 = &M[0];

    while ( firstcol < ncol - 7 ) { /* Do 8 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;
      Mki2 = Mki1 + ldm + 1;
      Mki3 = Mki2 + ldm + 1;
      Mki4 = Mki3 + ldm + 1;
      Mki5 = Mki4 + ldm + 1;
      Mki6 = Mki5 + ldm + 1;
      Mki7 = Mki6 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;
      x2 = rhs[firstcol+2] - x0 * *Mki0++ - x1 * *Mki1++;
      x3 = rhs[firstcol+3] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++;
      x4 = rhs[firstcol+4] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++;
      x5 = rhs[firstcol+5] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++;
      x6 = rhs[firstcol+6] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++ - x5 * *Mki5++;
      x7 = rhs[firstcol+7] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++ - x5 * *Mki5++
			   - x6 * *Mki6++;

      rhs[++firstcol] = x1;
      rhs[++firstcol] = x2;
      rhs[++firstcol] = x3;
      rhs[++firstcol] = x4;
      rhs[++firstcol] = x5;
      rhs[++firstcol] = x6;
      rhs[++firstcol] = x7;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++
	                - x2 * *Mki2++ - x3 * *Mki3++
                        - x4 * *Mki4++ - x5 * *Mki5++
			- x6 * *Mki6++ - x7 * *Mki7++;
 
      M0 += 8 * ldm + 8;
    }

    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;
      Mki2 = Mki1 + ldm + 1;
      Mki3 = Mki2 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;
      x2 = rhs[firstcol+2] - x0 * *Mki0++ - x1 * *Mki1++;
      x3 = rhs[firstcol+3] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++;

      rhs[++firstcol] = x1;
      rhs[++firstcol] = x2;
      rhs[++firstcol] = x3;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++
	                - x2 * *Mki2++ - x3 * *Mki3++;
 
      M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;

      rhs[++firstcol] = x1;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++;
 
    }
    
}